

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::MultiPartOutputFile::Data::writeChunkTableOffsets
          (Data *this,
          vector<Imf_3_3::OutputPartData_*,_std::allocator<Imf_3_3::OutputPartData_*>_> *parts)

{
  int iVar1;
  Header *pHVar2;
  long lVar3;
  uint64_t v;
  reference ppOVar4;
  vector<Imf_3_3::OutputPartData_*,_std::allocator<Imf_3_3::OutputPartData_*>_> *in_RSI;
  long in_RDI;
  uint64_t empty;
  int j;
  uint64_t pos;
  int chunkTableSize;
  size_t i;
  OStream *in_stack_ffffffffffffff80;
  Header *header;
  int local_60;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  Header *local_18;
  
  local_18 = (Header *)0x0;
  while( true ) {
    header = local_18;
    pHVar2 = (Header *)
             std::vector<Imf_3_3::OutputPartData_*,_std::allocator<Imf_3_3::OutputPartData_*>_>::
             size(in_RSI);
    if (pHVar2 <= header) break;
    std::vector<Imf_3_3::OutputPartData_*,_std::allocator<Imf_3_3::OutputPartData_*>_>::operator[]
              (in_RSI,(size_type)local_18);
    iVar1 = getChunkOffsetTableSize(header);
    lVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))();
    if (lVar3 == -1) {
      in_stack_ffffffffffffff80 = (OStream *)&stack0xffffffffffffffb7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      Iex_3_3::throwErrnoExc((string *)in_stack_ffffffffffffff80);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    }
    v = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))();
    ppOVar4 = std::vector<Imf_3_3::OutputPartData_*,_std::allocator<Imf_3_3::OutputPartData_*>_>::
              operator[](in_RSI,(size_type)local_18);
    (*ppOVar4)->chunkOffsetTablePosition = v;
    for (local_60 = 0; local_60 < iVar1; local_60 = local_60 + 1) {
      Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_stack_ffffffffffffff80,v);
    }
    local_18 = (Header *)&(local_18->_map)._M_t._M_impl.field_0x1;
  }
  return;
}

Assistant:

void
MultiPartOutputFile::Data::writeChunkTableOffsets (
    vector<OutputPartData*>& parts)
{
    for (size_t i = 0; i < parts.size (); i++)
    {
        int chunkTableSize = getChunkOffsetTableSize (parts[i]->header);

        uint64_t pos = os->tellp ();

        if (pos == static_cast<uint64_t> (-1))
            IEX_NAMESPACE::throwErrnoExc (
                "Cannot determine current file position (%T).");

        parts[i]->chunkOffsetTablePosition = os->tellp ();

        //
        // Fill in empty data for now. We'll write actual offsets during destruction.
        //

        for (int j = 0; j < chunkTableSize; j++)
        {
            uint64_t empty = 0;
            OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
                OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*os, empty);
        }
    }
}